

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# statement.cpp
# Opt level: O0

PrepareResult __thiscall Statement::prepareStatement(Statement *this,string *st)

{
  bool bVar1;
  int iVar2;
  char *__s1;
  string local_40;
  string *local_20;
  string *st_local;
  Statement *this_local;
  
  local_20 = st;
  st_local = (string *)this;
  __s1 = (char *)std::__cxx11::string::c_str();
  iVar2 = strncmp(__s1,"insert",6);
  if (iVar2 == 0) {
    this->type = Insert;
    std::__cxx11::string::string((string *)&local_40,(string *)st);
    this_local._4_4_ = prepareInsert(this,&local_40);
    std::__cxx11::string::~string((string *)&local_40);
  }
  else {
    bVar1 = std::operator==(st,"select");
    if (bVar1) {
      this->type = Select;
      this_local._4_4_ = PrepareSuccess;
    }
    else {
      this_local._4_4_ = PrepareUnrecognized;
    }
  }
  return this_local._4_4_;
}

Assistant:

PrepareResult Statement::prepareStatement(std::string st) {
	if (strncmp(st.c_str(), "insert", 6) == 0) {
		type = Insert;
		return prepareInsert(st);
	}
	if (st == "select") {
		type = Select;
		return PrepareSuccess;
	}

	return PrepareUnrecognized;
}